

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

char * google::protobuf::DoubleToBuffer(double value,char *buffer)

{
  char *pcVar1;
  bool bVar2;
  LogMessage *pLVar3;
  double dVar4;
  LogFinisher local_c2;
  byte local_c1;
  LogMessage local_c0;
  int local_84;
  double dStack_80;
  int snprintf_result_1;
  double parsed_value;
  byte local_61;
  LogMessage local_60;
  int local_24;
  char *pcStack_20;
  int snprintf_result;
  char *buffer_local;
  double value_local;
  
  pcStack_20 = buffer;
  buffer_local = (char *)value;
  dVar4 = std::numeric_limits<double>::infinity();
  pcVar1 = buffer_local;
  if ((value != dVar4) || (NAN(value) || NAN(dVar4))) {
    dVar4 = std::numeric_limits<double>::infinity();
    if (((double)pcVar1 != -dVar4) || (NAN((double)pcVar1) || NAN(-dVar4))) {
      bVar2 = MathLimits<double>::IsNaN((Type)buffer_local);
      if (bVar2) {
        strcpy(pcStack_20,"nan");
        value_local = (double)pcStack_20;
      }
      else {
        local_24 = snprintf(pcStack_20,0x20,"%.*g",buffer_local,0xf);
        local_61 = 0;
        if ((local_24 < 1) || (0x1f < local_24)) {
          internal::LogMessage::LogMessage
                    (&local_60,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                     ,0x501);
          local_61 = 1;
          pLVar3 = internal::LogMessage::operator<<
                             (&local_60,
                              "CHECK failed: snprintf_result > 0 && snprintf_result < kDoubleToBufferSize: "
                             );
          internal::LogFinisher::operator=((LogFinisher *)((long)&parsed_value + 3),pLVar3);
        }
        if ((local_61 & 1) != 0) {
          internal::LogMessage::~LogMessage(&local_60);
        }
        dStack_80 = strtod(pcStack_20,(char **)0x0);
        if ((dStack_80 != (double)buffer_local) || (NAN(dStack_80) || NAN((double)buffer_local))) {
          local_84 = snprintf(pcStack_20,0x20,"%.*g",buffer_local,0x11);
          local_c1 = 0;
          if ((local_84 < 1) || (0x1f < local_84)) {
            internal::LogMessage::LogMessage
                      (&local_c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/strutil.cc"
                       ,0x50f);
            local_c1 = 1;
            pLVar3 = internal::LogMessage::operator<<
                               (&local_c0,
                                "CHECK failed: snprintf_result > 0 && snprintf_result < kDoubleToBufferSize: "
                               );
            internal::LogFinisher::operator=(&local_c2,pLVar3);
          }
          if ((local_c1 & 1) != 0) {
            internal::LogMessage::~LogMessage(&local_c0);
          }
        }
        DelocalizeRadix(pcStack_20);
        value_local = (double)pcStack_20;
      }
    }
    else {
      strcpy(pcStack_20,"-inf");
      value_local = (double)pcStack_20;
    }
  }
  else {
    strcpy(pcStack_20,"inf");
    value_local = (double)pcStack_20;
  }
  return (char *)value_local;
}

Assistant:

char* DoubleToBuffer(double value, char* buffer) {
  // DBL_DIG is 15 for IEEE-754 doubles, which are used on almost all
  // platforms these days.  Just in case some system exists where DBL_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  GOOGLE_COMPILE_ASSERT(DBL_DIG < 20, DBL_DIG_is_too_big);

  if (value == numeric_limits<double>::infinity()) {
    strcpy(buffer, "inf");
    return buffer;
  } else if (value == -numeric_limits<double>::infinity()) {
    strcpy(buffer, "-inf");
    return buffer;
  } else if (MathLimits<double>::IsNaN(value)) {
    strcpy(buffer, "nan");
    return buffer;
  }

  int snprintf_result =
    snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);

  // We need to make parsed_value volatile in order to force the compiler to
  // write it out to the stack.  Otherwise, it may keep the value in a
  // register, and if it does that, it may keep it as a long double instead
  // of a double.  This long double may have extra bits that make it compare
  // unequal to "value" even though it would be exactly equal if it were
  // truncated to a double.
  volatile double parsed_value = strtod(buffer, NULL);
  if (parsed_value != value) {
    int snprintf_result =
      snprintf(buffer, kDoubleToBufferSize, "%.*g", DBL_DIG+2, value);

    // Should never overflow; see above.
    GOOGLE_DCHECK(snprintf_result > 0 && snprintf_result < kDoubleToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}